

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.cpp
# Opt level: O1

QLatin1StringView language::lookupEnum<6>(EnumLookup (*array) [6],int value,int defaultIndex)

{
  EnumLookup *pEVar1;
  ulong uVar2;
  char *unaff_RBX;
  EnumLookup *pEVar3;
  EnumLookup *pEVar4;
  qsizetype unaff_R14;
  long in_FS_OFFSET;
  bool bVar5;
  QLatin1StringView QVar6;
  char local_38 [24];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*array)[0].value == value) {
    bVar5 = false;
    pEVar3 = *array;
  }
  else {
    uVar2 = 0xffffffffffffffff;
    pEVar4 = *array;
    do {
      if (uVar2 == 4) {
        bVar5 = true;
        goto LAB_00153d4c;
      }
      pEVar3 = pEVar4 + 1;
      uVar2 = uVar2 + 1;
      pEVar1 = pEVar4 + 1;
      pEVar4 = pEVar3;
    } while (pEVar1->value != value);
    bVar5 = 4 < uVar2;
  }
  unaff_R14 = (pEVar3->valueString).m_size;
  unaff_RBX = (pEVar3->valueString).m_data;
LAB_00153d4c:
  if (bVar5) {
    unaff_R14 = (*array)[defaultIndex].valueString.m_size;
    unaff_RBX = (*array)[defaultIndex].valueString.m_data;
    local_38[0] = '\x02';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    local_38[8] = '\0';
    local_38[9] = '\0';
    local_38[10] = '\0';
    local_38[0xb] = '\0';
    local_38[0xc] = '\0';
    local_38[0xd] = '\0';
    local_38[0xe] = '\0';
    local_38[0xf] = '\0';
    local_38[0x10] = '\0';
    local_38[0x11] = '\0';
    local_38[0x12] = '\0';
    local_38[0x13] = '\0';
    local_38[0x14] = '\0';
    local_38[0x15] = '\0';
    local_38[0x16] = '\0';
    local_38[0x17] = '\0';
    local_20 = "default";
    QMessageLogger::warning
              (local_38,"uic: Warning: Invalid enumeration value %d, defaulting to %s",value,
               unaff_RBX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    QVar6.m_data = unaff_RBX;
    QVar6.m_size = unaff_R14;
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

QLatin1StringView lookupEnum(const EnumLookup(&array)[N], int value, int defaultIndex = 0)
{
    for (int i = 0; i < N; ++i) {
        if (value == array[i].value)
            return array[i].valueString;
    }
    auto defaultValue = array[defaultIndex].valueString;
    qWarning("uic: Warning: Invalid enumeration value %d, defaulting to %s",
             value, defaultValue.data());
    return defaultValue;
}